

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::
insert_simplex_and_subfaces<std::initializer_list<short>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this,
          initializer_list<short> *Nsimplex,Filtration_value *filtration)

{
  short sVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  Filtration_value *pFVar8;
  undefined1 *puVar9;
  undefined8 *puVar10;
  short sVar11;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var12;
  Filtration_value *pFVar13;
  const_iterator __cbeg;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> last;
  Filtration_value *filt;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar14;
  
  piVar3 = (filtration->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar3 == (pointer)0x0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    piVar4 = (filtration->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((char)in_FS_OFFSET[-9] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<short>>();
    }
    lVar5 = in_FS_OFFSET[-0xc];
    if (in_FS_OFFSET[-0xb] != lVar5) {
      in_FS_OFFSET[-0xb] = lVar5;
    }
    std::vector<short,std::allocator<short>>::_M_range_insert<short_const*>
              ((vector<short,std::allocator<short>> *)(*in_FS_OFFSET + -0x60),lVar5,piVar4,
               (long)piVar4 + (long)piVar3 * 2);
    last._M_current = (short *)in_FS_OFFSET[-0xc];
    filt = (Filtration_value *)in_FS_OFFSET[-0xb];
    if ((Filtration_value *)last._M_current != filt) {
      uVar7 = (long)filt - (long)last._M_current >> 1;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt);
      last._M_current = (short *)in_FS_OFFSET[-0xc];
      filt = (Filtration_value *)in_FS_OFFSET[-0xb];
    }
    if ((Filtration_value *)last._M_current != filt) {
      pFVar13 = (Filtration_value *)(last._M_current + 1);
      do {
        pFVar8 = pFVar13;
        if (pFVar8 == filt) goto LAB_00164de9;
        sVar11 = *(short *)((long)&pFVar8[-1].super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 6);
        pFVar13 = (Filtration_value *)
                  ((long)&(pFVar8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 2);
      } while (sVar11 != *(short *)&(pFVar8->super_vector<int,_std::allocator<int>_>).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
      puVar9 = (undefined1 *)
               ((long)&pFVar8[-1].super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage + 6);
      for (; pFVar13 != filt;
          pFVar13 = (Filtration_value *)
                    ((long)&(pFVar13->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 2)) {
        sVar1 = *(short *)&(pFVar13->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
        if (sVar11 != sVar1) {
          *(short *)(puVar9 + 2) = sVar1;
          puVar9 = puVar9 + 2;
        }
        sVar11 = sVar1;
      }
      pFVar13 = (Filtration_value *)(puVar9 + 2);
      if (pFVar13 != filt) {
        in_FS_OFFSET[-0xb] = (long)pFVar13;
        filt = pFVar13;
      }
    }
LAB_00164de9:
    if ((Filtration_value *)last._M_current != filt) {
      _Var12._M_current = last._M_current;
      do {
        if (*(short *)&(((Filtration_value *)_Var12._M_current)->
                       super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start == (short)Nsimplex[3]._M_len) {
          puVar10 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar10 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar10,&char_const*::typeinfo,0);
        }
        _Var12._M_current =
             (short *)((long)&(((Filtration_value *)_Var12._M_current)->
                              super_vector<int,_std::allocator<int>_>).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 2);
      } while ((Filtration_value *)_Var12._M_current != filt);
    }
    iVar6 = (int)((ulong)((long)filt - (long)last._M_current) >> 1) + -1;
    iVar2 = (int)Nsimplex[8]._M_len;
    if (iVar6 < iVar2) {
      iVar6 = iVar2;
    }
    *(int *)&Nsimplex[8]._M_len = iVar6;
    pVar14 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                        (Nsimplex + 4),last,filt);
    filtration = pVar14._8_8_;
  }
  pVar14._8_8_ = filtration;
  pVar14.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar14;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }